

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# various_input.cpp
# Opt level: O1

void use_peek(void)

{
  char cVar1;
  undefined1 uVar2;
  int iVar3;
  undefined8 in_RAX;
  long *plVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  char ch;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  plVar4 = (long *)std::istream::get((char *)&std::cin);
  if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
    do {
      cVar1 = uStack_38._3_1_;
      if (uStack_38._3_1_ == '#') {
        std::istream::putback('(');
        break;
      }
      uStack_38._0_5_ = CONCAT14(cVar1,(undefined4)uStack_38);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)((long)&uStack_38 + 4),1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"-",1);
      plVar4 = (long *)std::istream::get((char *)&std::cin);
    } while ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0);
  }
  if (((byte)cos[*(long *)(std::cin + -0x18)] & 2) != 0) {
    std::operator<<((ostream *)&std::cout,"EOF reached.\n");
  }
  std::istream::get((char *)&std::cin);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  poVar5 = (ostream *)std::ostream::flush();
  uVar2 = uStack_38._3_1_;
  uStack_38._0_7_ = CONCAT16(uVar2,(undefined6)uStack_38);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)((long)&uStack_38 + 6),1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," is the next char.\n",0x13);
  iVar3 = std::istream::peek();
  if (iVar3 != 0x23) {
    do {
      std::istream::get((char *)&std::cin);
      uVar2 = uStack_38._3_1_;
      uStack_38._0_6_ = CONCAT15(uVar2,(undefined5)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)((long)&uStack_38 + 5),1);
      iVar3 = std::istream::peek();
    } while (iVar3 != 0x23);
  }
  if (((byte)cos[*(long *)(std::cin + -0x18)] & 2) == 0) {
    std::istream::get((char *)&std::cin);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    poVar5 = (ostream *)std::ostream::flush();
    uVar2 = uStack_38._3_1_;
    uStack_38 = CONCAT17(uVar2,(undefined7)uStack_38);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)((long)&uStack_38 + 7),1);
    pcVar7 = " is the next char.\n";
    lVar6 = 0x13;
  }
  else {
    poVar5 = (ostream *)&std::cout;
    pcVar7 = "EOF reached.\n";
    lVar6 = 0xd;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar7,lVar6);
  return;
}

Assistant:

void use_peek() {
    using namespace std;

    char ch;
    while(cin.get(ch)) {    //  stop when EOF
        if (ch != '#') {
            cout << ch << "-";
        } else {
            //  make '#' back into stream
            cin.putback(ch);
            break;
        }
    }

    if (!cin.eof()) {
        cin.get(ch);    // always '#'
        cout << endl << ch << " is the next char.\n";
    } else {
        cout << "EOF reached.\n";
        exit(0);
    }

    //  read until meet '#'
    while(cin.peek() != '#') {
        cin.get(ch);
        cout << ch;
    }
    if (!cin.eof()) {
        cin.get(ch);    //  always '#'
        cout << endl << ch << " is the next char.\n";
    } else {
        cout << "EOF reached.\n";
    }
}